

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O3

void __thiscall QtMWidgets::ToolButton::mouseReleaseEvent(ToolButton *this,QMouseEvent *e)

{
  ToolButtonPrivate *pTVar1;
  QMouseEvent QVar2;
  
  if (*(int *)(e + 0x40) == 1) {
    pTVar1 = (this->d).d;
    QVar2 = (QMouseEvent)0x1;
    if (pTVar1->leftButtonPressed == true) {
      pTVar1->leftButtonPressed = false;
      QAction::activate((ActionEvent)pTVar1->action);
    }
  }
  else {
    QVar2 = (QMouseEvent)0x0;
  }
  e[0xc] = QVar2;
  return;
}

Assistant:

void
ToolButton::mouseReleaseEvent( QMouseEvent * e )
{
	if( e->button() == Qt::LeftButton )
	{
		if( d->leftButtonPressed )
		{
			d->leftButtonPressed = false;
			d->action->trigger();
		}

		e->accept();
	}
	else
		e->ignore();
}